

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O0

int ngram_model_set_apply_weights(ngram_model_t *base,float32 lw,float32 wip)

{
  int local_24;
  int32 i;
  ngram_model_set_t *set;
  float32 wip_local;
  float32 lw_local;
  ngram_model_t *base_local;
  
  for (local_24 = 0; local_24 < base[1].refcount; local_24 = local_24 + 1) {
    ngram_model_apply_weights(*(ngram_model_t **)(base[1].n_counts + (long)local_24 * 2),lw,wip);
  }
  return 0;
}

Assistant:

static int
ngram_model_set_apply_weights(ngram_model_t * base, float32 lw,
                              float32 wip)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    int32 i;

    /* Apply weights to each sub-model. */
    for (i = 0; i < set->n_models; ++i)
        ngram_model_apply_weights(set->lms[i], lw, wip);
    return 0;
}